

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O3

REF_STATUS ref_cell_global(REF_CELL ref_cell,REF_NODE ref_node,REF_LONG **global)

{
  REF_MPI ref_mpi;
  uint uVar1;
  REF_LONG *pRVar2;
  void *array;
  long lVar3;
  undefined8 uVar4;
  REF_STATUS RVar5;
  REF_NODE ref_node_00;
  char *pcVar6;
  int iVar7;
  REF_INT cell;
  long lVar8;
  REF_INT part;
  REF_INT ncell;
  int local_4c;
  REF_NODE local_48;
  int local_3c;
  REF_LONG **local_38;
  
  iVar7 = ref_cell->max;
  if ((long)iVar7 < 0) {
    pcVar6 = "malloc *global of REF_LONG negative";
    uVar4 = 0x5c6;
LAB_00113c8a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_global",pcVar6);
    RVar5 = 1;
  }
  else {
    ref_mpi = ref_node->ref_mpi;
    pRVar2 = (REF_LONG *)malloc((long)iVar7 * 8);
    *global = pRVar2;
    if (pRVar2 == (REF_LONG *)0x0) {
      pcVar6 = "malloc *global of REF_LONG NULL";
      uVar4 = 0x5c6;
    }
    else {
      local_3c = 0;
      local_48 = ref_node;
      local_38 = global;
      if (iVar7 != 0) {
        iVar7 = 0;
        cell = 0;
        do {
          if (ref_cell->c2n[(long)cell * (long)ref_cell->size_per] != -1) {
            uVar1 = ref_cell_part(ref_cell,ref_node,cell,&local_4c);
            if (uVar1 != 0) {
              pcVar6 = "cell part";
              uVar4 = 0x5ca;
              goto LAB_00113cbb;
            }
            ref_node = local_48;
            if (ref_mpi->id == local_4c) {
              iVar7 = iVar7 + 1;
              local_3c = iVar7;
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      if ((long)ref_mpi->n < 0) {
        pcVar6 = "malloc counts of REF_INT negative";
        uVar4 = 0x5d0;
        goto LAB_00113c8a;
      }
      array = malloc((long)ref_mpi->n << 2);
      if (array != (void *)0x0) {
        uVar1 = ref_mpi_allgather(ref_mpi,&local_3c,array,1);
        ref_node_00 = local_48;
        if (uVar1 == 0) {
          if ((long)ref_mpi->id < 1) {
            lVar8 = 0;
          }
          else {
            lVar3 = 0;
            lVar8 = 0;
            do {
              lVar8 = lVar8 + *(int *)((long)array + lVar3 * 4);
              lVar3 = lVar3 + 1;
            } while (ref_mpi->id != lVar3);
          }
          free(array);
          if (0 < ref_cell->max) {
            lVar3 = 0;
            do {
              if (ref_cell->c2n[(long)(int)lVar3 * (long)ref_cell->size_per] != -1) {
                uVar1 = ref_cell_part(ref_cell,ref_node_00,(int)lVar3,&local_4c);
                if (uVar1 != 0) {
                  pcVar6 = "cell part";
                  uVar4 = 0x5d7;
                  goto LAB_00113cbb;
                }
                ref_node_00 = local_48;
                if (ref_mpi->id == local_4c) {
                  (*local_38)[lVar3] = lVar8;
                  lVar8 = lVar8 + 1;
                }
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < ref_cell->max);
          }
          uVar1 = ref_cell_ghost_long(ref_cell,ref_node_00,*local_38);
          if (uVar1 == 0) {
            return 0;
          }
          pcVar6 = "ghost";
          uVar4 = 0x5de;
        }
        else {
          pcVar6 = "gather size";
          uVar4 = 0x5d1;
        }
LAB_00113cbb:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               uVar4,"ref_cell_global",(ulong)uVar1,pcVar6);
        return uVar1;
      }
      pcVar6 = "malloc counts of REF_INT NULL";
      uVar4 = 0x5d0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar4,
           "ref_cell_global",pcVar6);
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_cell_global(REF_CELL ref_cell, REF_NODE ref_node,
                                   REF_LONG **global) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT ncell, cell, part, *counts, proc;
  REF_LONG offset;

  ref_malloc(*global, ref_cell_max(ref_cell), REF_LONG);

  ncell = 0;
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
  }

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &ncell, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) offset += counts[proc];
  ref_free(counts);

  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "cell part");
    if (ref_mpi_rank(ref_mpi) == part) {
      (*global)[cell] = offset;
      offset++;
    }
  }

  RSS(ref_cell_ghost_long(ref_cell, ref_node, *global), "ghost");

  return REF_SUCCESS;
}